

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getEnterVals2(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int leaveIdx,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *enterMax,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *leavebound,
               StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *objChange)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  undefined8 uVar5;
  pointer pnVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  Status SVar12;
  pointer pnVar13;
  Status *pSVar14;
  undefined8 *puVar15;
  long lVar16;
  undefined8 uVar17;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  cpp_dec_float<50U,_int,_void> *pcVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId leftId;
  cpp_dec_float<50U,_int,_void> local_f8;
  cpp_dec_float<50U,_int,_void> *local_c0;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_78;
  DataKey local_38;
  
  lVar23 = (long)leaveIdx;
  local_38 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).theBaseId.data[lVar23].super_DataKey;
  local_c0 = (cpp_dec_float<50U,_int,_void> *)objChange;
  if (local_38.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_f8,(SPxId *)&local_38);
    iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_f8);
    pcVar21 = local_c0;
    lVar22 = (long)iVar11;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data[lVar22]) {
    case D_FREE:
      pnVar13 = (this->theFvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar24 = lVar23 * 0x38;
      local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
      local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
      local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
      local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_78.exp = pnVar13[lVar23].m_backend.exp;
      local_78.neg = pnVar13[lVar23].m_backend.neg;
      local_78.fpclass = pnVar13[lVar23].m_backend.fpclass;
      local_78.prec_elem = pnVar13[lVar23].m_backend.prec_elem;
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 10;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems._24_5_ = 0;
      local_b8.data._M_elems[7]._1_3_ = 0;
      local_b8.data._M_elems._32_5_ = 0;
      local_b8.data._M_elems[9]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      if (&local_b8 == &enterMax->m_backend) {
        enterMax = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_78;
      }
      else {
        local_b8.data._M_elems._32_5_ = local_78.data._M_elems._32_5_;
        local_b8.data._M_elems[9]._1_3_ = local_78.data._M_elems[9]._1_3_;
        local_b8.data._M_elems._24_5_ = local_78.data._M_elems._24_5_;
        local_b8.data._M_elems[7]._1_3_ = local_78.data._M_elems[7]._1_3_;
        local_b8.prec_elem = local_78.prec_elem;
        local_b8.fpclass = local_78.fpclass;
        local_b8.data._M_elems._0_8_ = local_78.data._M_elems._0_8_;
        local_b8.data._M_elems._8_8_ = local_78.data._M_elems._8_8_;
        local_b8.data._M_elems._16_8_ = local_78.data._M_elems._16_8_;
        local_b8.exp = local_78.exp;
        local_b8.neg = local_78.neg;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_b8,&enterMax->m_backend);
      if (local_b8.fpclass == cpp_dec_float_NaN) {
LAB_0024561a:
        lVar16 = 0xa28;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_f8,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b8,&local_f8);
        if (-1 < iVar11) goto LAB_0024561a;
        lVar16 = 0xa10;
      }
      pcVar21 = local_c0;
      lVar16 = *(long *)((long)&(this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray + lVar16);
      uVar17 = *(undefined8 *)(lVar16 + 0x20 + lVar24);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      uVar7 = *(undefined8 *)(lVar16 + lVar24);
      uVar8 = ((undefined8 *)(lVar16 + lVar24))[1];
      puVar15 = (undefined8 *)(lVar16 + 0x10 + lVar24);
      uVar9 = *puVar15;
      uVar10 = puVar15[1];
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar9;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar10;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar7;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar8;
      (leavebound->m_backend).exp = *(int *)(lVar16 + 0x28 + lVar24);
      (leavebound->m_backend).neg = *(bool *)(lVar16 + 0x2c + lVar24);
      uVar5 = *(undefined8 *)(lVar16 + 0x30 + lVar24);
      (leavebound->m_backend).fpclass = (int)uVar5;
      (leavebound->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
      pnVar13 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
      puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar9;
      *(undefined8 *)(puVar1 + 2) = uVar10;
      *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar7;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar8;
      pnVar13[lVar22].m_backend.exp = (leavebound->m_backend).exp;
      pnVar13[lVar22].m_backend.neg = (leavebound->m_backend).neg;
      iVar4 = (leavebound->m_backend).prec_elem;
      pnVar13[lVar22].m_backend.fpclass = (leavebound->m_backend).fpclass;
      pnVar13[lVar22].m_backend.prec_elem = iVar4;
      pnVar13 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) =
           *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
      uVar17 = *(undefined8 *)(leavebound->m_backend).data._M_elems;
      uVar5 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
      uVar7 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
      puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
      *(undefined8 *)(puVar1 + 2) = uVar7;
      *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar17;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar5;
      iVar11 = (leavebound->m_backend).exp;
      pnVar13[lVar22].m_backend.exp = iVar11;
      bVar2 = (leavebound->m_backend).neg;
      pnVar13[lVar22].m_backend.neg = bVar2;
      fVar3 = (leavebound->m_backend).fpclass;
      pnVar13[lVar22].m_backend.fpclass = fVar3;
      iVar4 = (leavebound->m_backend).prec_elem;
      pnVar13[lVar22].m_backend.prec_elem = iVar4;
      pcVar20 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar18 = &leavebound->m_backend;
      if ((&local_f8 != pcVar20) && (pcVar18 = pcVar20, &local_f8 != &leavebound->m_backend)) {
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.prec_elem = iVar4;
        local_f8.fpclass = fVar3;
        local_f8.exp = iVar11;
        local_f8.neg = bVar2;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar21,&local_f8);
      pSVar14 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_00245a33;
    case D_ON_UPPER:
      pnVar13 = (this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      uVar5 = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
      uVar7 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
      uVar8 = *(undefined8 *)puVar1;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar8;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar9;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar7;
      (leavebound->m_backend).exp = pnVar13[lVar23].m_backend.exp;
      (leavebound->m_backend).neg = pnVar13[lVar23].m_backend.neg;
      iVar4 = pnVar13[lVar23].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar13[lVar23].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar4;
      pnVar13 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
      puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar8;
      *(undefined8 *)(puVar1 + 2) = uVar9;
      *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar5;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar7;
      iVar11 = (leavebound->m_backend).exp;
      pnVar13[lVar22].m_backend.exp = iVar11;
      bVar2 = (leavebound->m_backend).neg;
      pnVar13[lVar22].m_backend.neg = bVar2;
      fVar3 = (leavebound->m_backend).fpclass;
      pnVar13[lVar22].m_backend.fpclass = fVar3;
      iVar4 = (leavebound->m_backend).prec_elem;
      pnVar13[lVar22].m_backend.prec_elem = iVar4;
      pcVar20 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar18 = &leavebound->m_backend;
      if ((&local_f8 != pcVar20) && (pcVar18 = pcVar20, &local_f8 != &leavebound->m_backend)) {
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.prec_elem = iVar4;
        local_f8.fpclass = fVar3;
        local_f8.exp = iVar11;
        local_f8.neg = bVar2;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
LAB_00245594:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar21,&local_f8);
      pSVar14 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_002455a0;
    case D_ON_LOWER:
      pnVar13 = (this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      uVar5 = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
      uVar7 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
      uVar8 = *(undefined8 *)puVar1;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar8;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar9;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar7;
      (leavebound->m_backend).exp = pnVar13[lVar23].m_backend.exp;
      (leavebound->m_backend).neg = pnVar13[lVar23].m_backend.neg;
      iVar4 = pnVar13[lVar23].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar13[lVar23].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar4;
      pnVar13 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
      puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar8;
      *(undefined8 *)(puVar1 + 2) = uVar9;
      *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar5;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar7;
      iVar11 = (leavebound->m_backend).exp;
      pnVar13[lVar22].m_backend.exp = iVar11;
      bVar2 = (leavebound->m_backend).neg;
      pnVar13[lVar22].m_backend.neg = bVar2;
      fVar3 = (leavebound->m_backend).fpclass;
      pnVar13[lVar22].m_backend.fpclass = fVar3;
      iVar4 = (leavebound->m_backend).prec_elem;
      pnVar13[lVar22].m_backend.prec_elem = iVar4;
      pcVar20 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar18 = &leavebound->m_backend;
      if ((&local_f8 != pcVar20) && (pcVar18 = pcVar20, &local_f8 != &leavebound->m_backend)) {
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.prec_elem = iVar4;
        local_f8.fpclass = fVar3;
        local_f8.exp = iVar11;
        local_f8.neg = bVar2;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
      goto LAB_0024578c;
    case D_ON_BOTH:
      pnVar13 = (this->theFvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
      local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
      local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
      local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_78.exp = pnVar13[lVar23].m_backend.exp;
      local_78.neg = pnVar13[lVar23].m_backend.neg;
      local_78.fpclass = pnVar13[lVar23].m_backend.fpclass;
      local_78.prec_elem = pnVar13[lVar23].m_backend.prec_elem;
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 10;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems._24_5_ = 0;
      local_b8.data._M_elems[7]._1_3_ = 0;
      local_b8.data._M_elems._32_5_ = 0;
      local_b8.data._M_elems[9]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      if (&local_b8 != &enterMax->m_backend) {
        uVar17 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 8);
        local_b8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_b8.data._M_elems._0_8_ = *(undefined8 *)(enterMax->m_backend).data._M_elems;
        local_b8.data._M_elems._8_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 2);
        local_b8.data._M_elems._16_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 6);
        local_b8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_b8.exp = (enterMax->m_backend).exp;
        local_b8.neg = (enterMax->m_backend).neg;
        local_b8.fpclass = (enterMax->m_backend).fpclass;
        local_b8.prec_elem = (enterMax->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_b8,&local_78);
      if (local_b8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_f8,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_b8,&local_f8);
        pcVar21 = local_c0;
        if (iVar11 < 0) {
          pnVar13 = (this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
          uVar5 = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
          uVar7 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
          uVar8 = *(undefined8 *)puVar1;
          uVar9 = *(undefined8 *)(puVar1 + 2);
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar8;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar9;
          *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar5;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar7;
          (leavebound->m_backend).exp = pnVar13[lVar23].m_backend.exp;
          (leavebound->m_backend).neg = pnVar13[lVar23].m_backend.neg;
          iVar4 = pnVar13[lVar23].m_backend.prec_elem;
          (leavebound->m_backend).fpclass = pnVar13[lVar23].m_backend.fpclass;
          (leavebound->m_backend).prec_elem = iVar4;
          pnVar13 = (this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
          puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = uVar8;
          *(undefined8 *)(puVar1 + 2) = uVar9;
          *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar5;
          *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar7;
          iVar11 = (leavebound->m_backend).exp;
          pnVar13[lVar22].m_backend.exp = iVar11;
          bVar2 = (leavebound->m_backend).neg;
          pnVar13[lVar22].m_backend.neg = bVar2;
          fVar3 = (leavebound->m_backend).fpclass;
          pnVar13[lVar22].m_backend.fpclass = fVar3;
          iVar4 = (leavebound->m_backend).prec_elem;
          pnVar13[lVar22].m_backend.prec_elem = iVar4;
          pcVar20 = &(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend;
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems._24_5_ = 0;
          local_f8.data._M_elems[7]._1_3_ = 0;
          local_f8.data._M_elems._32_5_ = 0;
          local_f8.data._M_elems[9]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          pcVar18 = &leavebound->m_backend;
          if ((&local_f8 != pcVar20) && (pcVar18 = pcVar20, &local_f8 != &leavebound->m_backend)) {
            uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
            local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
            local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
            local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
            local_f8.data._M_elems._8_8_ =
                 *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
            local_f8.data._M_elems._16_8_ =
                 *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
            uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
            local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
            local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
            local_f8.prec_elem = iVar4;
            local_f8.fpclass = fVar3;
            local_f8.exp = iVar11;
            local_f8.neg = bVar2;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_f8,pcVar18);
          goto LAB_00245594;
        }
      }
      pcVar21 = local_c0;
      pnVar13 = (this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      uVar5 = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
      uVar7 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
      uVar8 = *(undefined8 *)puVar1;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar8;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar9;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar7;
      (leavebound->m_backend).exp = pnVar13[lVar23].m_backend.exp;
      (leavebound->m_backend).neg = pnVar13[lVar23].m_backend.neg;
      iVar4 = pnVar13[lVar23].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar13[lVar23].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar4;
      pnVar13 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
      puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar8;
      *(undefined8 *)(puVar1 + 2) = uVar9;
      *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar5;
      *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar7;
      iVar11 = (leavebound->m_backend).exp;
      pnVar13[lVar22].m_backend.exp = iVar11;
      bVar2 = (leavebound->m_backend).neg;
      pnVar13[lVar22].m_backend.neg = bVar2;
      fVar3 = (leavebound->m_backend).fpclass;
      pnVar13[lVar22].m_backend.fpclass = fVar3;
      iVar4 = (leavebound->m_backend).prec_elem;
      pnVar13[lVar22].m_backend.prec_elem = iVar4;
      pcVar20 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar18 = &leavebound->m_backend;
      if ((&local_f8 != pcVar20) && (pcVar18 = pcVar20, &local_f8 != &leavebound->m_backend)) {
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.prec_elem = iVar4;
        local_f8.fpclass = fVar3;
        local_f8.exp = iVar11;
        local_f8.neg = bVar2;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
LAB_0024578c:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar21,&local_f8);
      pSVar14 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
LAB_0024589e:
      pSVar14[lVar22] = P_ON_UPPER;
      return;
    case D_UNDEFINED:
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XENTER06 This should never happen.","");
      *puVar15 = &PTR__SPxException_0069d438;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar15 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_FIXED:
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XENTER04 This should never happen.","");
      *puVar15 = &PTR__SPxException_0069d438;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar15 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XENTER07 This should never happen.","");
      *puVar15 = &PTR__SPxException_0069d438;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar15 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      pnVar6 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar6[lVar23].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      pnVar13 = pnVar6 + lVar23;
      uVar25 = (pnVar13->m_backend).data._M_elems[0];
      uVar26 = *(uint *)((long)&(pnVar13->m_backend).data + 4);
      uVar27 = *(uint *)((long)&(pnVar13->m_backend).data + 8);
      uVar28 = *(uint *)((long)&(pnVar13->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar6[lVar23].m_backend.data + 0x10);
      uVar29 = *puVar1;
      uVar30 = puVar1[1];
      uVar31 = puVar1[2];
      uVar32 = puVar1[3];
      (leavebound->m_backend).data._M_elems[4] = uVar29;
      (leavebound->m_backend).data._M_elems[5] = uVar30;
      (leavebound->m_backend).data._M_elems[6] = uVar31;
      (leavebound->m_backend).data._M_elems[7] = uVar32;
      (leavebound->m_backend).data._M_elems[0] = uVar25;
      (leavebound->m_backend).data._M_elems[1] = uVar26;
      (leavebound->m_backend).data._M_elems[2] = uVar27;
      (leavebound->m_backend).data._M_elems[3] = uVar28;
      (leavebound->m_backend).exp = pnVar6[lVar23].m_backend.exp;
      (leavebound->m_backend).neg = pnVar6[lVar23].m_backend.neg;
      iVar4 = pnVar6[lVar23].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar6[lVar23].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar4;
      pnVar13 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      pnVar6 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar6[lVar23].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      pnVar13 = pnVar6 + lVar23;
      uVar25 = (pnVar13->m_backend).data._M_elems[0];
      uVar26 = *(uint *)((long)&(pnVar13->m_backend).data + 4);
      uVar27 = *(uint *)((long)&(pnVar13->m_backend).data + 8);
      uVar28 = *(uint *)((long)&(pnVar13->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar6[lVar23].m_backend.data + 0x10);
      uVar29 = *puVar1;
      uVar30 = puVar1[1];
      uVar31 = puVar1[2];
      uVar32 = puVar1[3];
      (leavebound->m_backend).data._M_elems[4] = uVar29;
      (leavebound->m_backend).data._M_elems[5] = uVar30;
      (leavebound->m_backend).data._M_elems[6] = uVar31;
      (leavebound->m_backend).data._M_elems[7] = uVar32;
      (leavebound->m_backend).data._M_elems[0] = uVar25;
      (leavebound->m_backend).data._M_elems[1] = uVar26;
      (leavebound->m_backend).data._M_elems[2] = uVar27;
      (leavebound->m_backend).data._M_elems[3] = uVar28;
      (leavebound->m_backend).exp = pnVar6[lVar23].m_backend.exp;
      (leavebound->m_backend).neg = pnVar6[lVar23].m_backend.neg;
      iVar4 = pnVar6[lVar23].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar6[lVar23].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar4;
      pnVar13 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XENTER05 This should never happen.","");
      *puVar15 = &PTR__SPxException_0069d438;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar15 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
    *puVar1 = uVar29;
    puVar1[1] = uVar30;
    puVar1[2] = uVar31;
    puVar1[3] = uVar32;
    pnVar6 = pnVar13 + lVar22;
    (pnVar6->m_backend).data._M_elems[0] = uVar25;
    *(uint *)((long)&(pnVar6->m_backend).data + 4) = uVar26;
    *(uint *)((long)&(pnVar6->m_backend).data + 8) = uVar27;
    *(uint *)((long)&(pnVar6->m_backend).data + 0xc) = uVar28;
    pnVar13[lVar22].m_backend.exp = (leavebound->m_backend).exp;
    pnVar13[lVar22].m_backend.neg = (leavebound->m_backend).neg;
    iVar4 = (leavebound->m_backend).prec_elem;
    pnVar13[lVar22].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar13[lVar22].m_backend.prec_elem = iVar4;
    SVar12 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(&this->
                              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,iVar11);
    pcVar21 = local_c0;
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar22] = SVar12;
    if (SVar12 == D_ON_BOTH) {
      pcVar20 = &(this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend;
      pcVar19 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar18 = pcVar20;
      if ((&local_f8 != pcVar19) && (pcVar18 = pcVar19, &local_f8 != pcVar20)) {
        uVar17 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
        uVar17 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = pcVar20->exp;
        local_f8.neg = pcVar20->neg;
        local_f8.fpclass = pcVar20->fpclass;
        local_f8.prec_elem = pcVar20->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar21,&local_f8);
      pcVar20 = &(this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend;
      pcVar19 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar18 = pcVar20;
      if ((&local_f8 != pcVar19) && (pcVar18 = pcVar19, &local_f8 != pcVar20)) {
        uVar17 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
        uVar17 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = pcVar20->exp;
        local_f8.neg = pcVar20->neg;
        local_f8.fpclass = pcVar20->fpclass;
        local_f8.prec_elem = pcVar20->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
    }
    else {
      if (SVar12 == D_ON_LOWER) {
        pnVar13 = (this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar6 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if (SVar12 != D_ON_UPPER) {
          return;
        }
        pnVar13 = (this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar6 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar19 = &pnVar6[lVar22].m_backend;
      pcVar20 = &pnVar13[lVar22].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar18 = pcVar20;
      if ((&local_f8 != pcVar19) && (pcVar18 = pcVar19, &local_f8 != pcVar20)) {
        uVar17 = *(undefined8 *)((pcVar20->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
        uVar17 = *(undefined8 *)((pcVar20->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = pcVar20->exp;
        local_f8.neg = pcVar20->neg;
        local_f8.fpclass = pcVar20->fpclass;
        local_f8.prec_elem = pcVar20->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
    }
    goto LAB_00245c91;
  }
  SPxColId::SPxColId((SPxColId *)&local_f8,(SPxId *)&local_38);
  iVar11 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           ::number(&(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set,(DataKey *)&local_f8);
  lVar22 = (long)iVar11;
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.colstat.data[lVar22]) {
  case D_FREE:
    pnVar13 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar24 = lVar23 * 0x38;
    local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
    local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
    local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
    local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_78.exp = pnVar13[lVar23].m_backend.exp;
    local_78.neg = pnVar13[lVar23].m_backend.neg;
    local_78.fpclass = pnVar13[lVar23].m_backend.fpclass;
    local_78.prec_elem = pnVar13[lVar23].m_backend.prec_elem;
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    if (&local_b8 == &enterMax->m_backend) {
      enterMax = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_78;
    }
    else {
      local_b8.data._M_elems._32_5_ = local_78.data._M_elems._32_5_;
      local_b8.data._M_elems[9]._1_3_ = local_78.data._M_elems[9]._1_3_;
      local_b8.data._M_elems._24_5_ = local_78.data._M_elems._24_5_;
      local_b8.data._M_elems[7]._1_3_ = local_78.data._M_elems[7]._1_3_;
      local_b8.prec_elem = local_78.prec_elem;
      local_b8.fpclass = local_78.fpclass;
      local_b8.data._M_elems._0_8_ = local_78.data._M_elems._0_8_;
      local_b8.data._M_elems._8_8_ = local_78.data._M_elems._8_8_;
      local_b8.data._M_elems._16_8_ = local_78.data._M_elems._16_8_;
      local_b8.exp = local_78.exp;
      local_b8.neg = local_78.neg;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_b8,&enterMax->m_backend);
    if (local_b8.fpclass == cpp_dec_float_NaN) {
LAB_0024590a:
      lVar23 = 0xa10;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_f8,0,(type *)0x0);
      iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_b8,&local_f8);
      lVar23 = 0xa28;
      if (iVar11 < 1) goto LAB_0024590a;
    }
    pcVar21 = local_c0;
    lVar23 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar23);
    uVar17 = *(undefined8 *)(lVar23 + 0x20 + lVar24);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar7 = *(undefined8 *)(lVar23 + lVar24);
    uVar8 = ((undefined8 *)(lVar23 + lVar24))[1];
    puVar15 = (undefined8 *)(lVar23 + 0x10 + lVar24);
    uVar9 = *puVar15;
    uVar10 = puVar15[1];
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar9;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar7;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar8;
    (leavebound->m_backend).exp = *(int *)(lVar23 + 0x28 + lVar24);
    (leavebound->m_backend).neg = *(bool *)(lVar23 + 0x2c + lVar24);
    uVar5 = *(undefined8 *)(lVar23 + 0x30 + lVar24);
    (leavebound->m_backend).fpclass = (int)uVar5;
    (leavebound->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
    pnVar13 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar9;
    *(undefined8 *)(puVar1 + 2) = uVar10;
    *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar7;
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar8;
    pnVar13[lVar22].m_backend.exp = (leavebound->m_backend).exp;
    pnVar13[lVar22].m_backend.neg = (leavebound->m_backend).neg;
    iVar4 = (leavebound->m_backend).prec_elem;
    pnVar13[lVar22].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar13[lVar22].m_backend.prec_elem = iVar4;
    pnVar6 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar6[lVar22].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar6[lVar22].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar9;
    *(undefined8 *)(puVar1 + 2) = uVar10;
    *(undefined8 *)&pnVar6[lVar22].m_backend.data = uVar7;
    *(undefined8 *)((long)&pnVar6[lVar22].m_backend.data + 8) = uVar8;
    pnVar6[lVar22].m_backend.exp = pnVar13[lVar22].m_backend.exp;
    pnVar6[lVar22].m_backend.neg = pnVar13[lVar22].m_backend.neg;
    iVar4 = pnVar13[lVar22].m_backend.prec_elem;
    pnVar6[lVar22].m_backend.fpclass = pnVar13[lVar22].m_backend.fpclass;
    pnVar6[lVar22].m_backend.prec_elem = iVar4;
    pcVar20 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend;
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    pcVar18 = pcVar20;
    if ((&local_f8 != &leavebound->m_backend) &&
       (pcVar18 = &leavebound->m_backend, &local_f8 != pcVar20)) {
      uVar17 = *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems + 8);
      local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
      local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_f8.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems;
      local_f8.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems + 2);
      local_f8.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems + 4);
      uVar17 = *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems + 6);
      local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
      local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_f8.exp = pcVar20->exp;
      local_f8.neg = pcVar20->neg;
      local_f8.fpclass = pcVar20->fpclass;
      local_f8.prec_elem = pcVar20->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar21,&local_f8);
    pSVar14 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_00245a33:
    pSVar14[lVar22] = P_FIXED;
    return;
  case D_ON_UPPER:
    pnVar13 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar5 = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
    uVar7 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
    uVar8 = *(undefined8 *)puVar1;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar8;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar9;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar5;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar7;
    (leavebound->m_backend).exp = pnVar13[lVar23].m_backend.exp;
    (leavebound->m_backend).neg = pnVar13[lVar23].m_backend.neg;
    iVar4 = pnVar13[lVar23].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar13[lVar23].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar4;
    pnVar13 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar8;
    *(undefined8 *)(puVar1 + 2) = uVar9;
    *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar5;
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar7;
    pnVar13[lVar22].m_backend.exp = (leavebound->m_backend).exp;
    pnVar13[lVar22].m_backend.neg = (leavebound->m_backend).neg;
    iVar4 = (leavebound->m_backend).prec_elem;
    pnVar13[lVar22].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar13[lVar22].m_backend.prec_elem = iVar4;
    goto LAB_00244eb6;
  case D_ON_LOWER:
    pnVar13 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar5 = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
    uVar7 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
    uVar8 = *(undefined8 *)puVar1;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar8;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar9;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar5;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar7;
    (leavebound->m_backend).exp = pnVar13[lVar23].m_backend.exp;
    (leavebound->m_backend).neg = pnVar13[lVar23].m_backend.neg;
    iVar4 = pnVar13[lVar23].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar13[lVar23].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar4;
    pnVar13 = (this->theUCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar8;
    *(undefined8 *)(puVar1 + 2) = uVar9;
    *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar5;
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar7;
    pnVar13[lVar22].m_backend.exp = (leavebound->m_backend).exp;
    pnVar13[lVar22].m_backend.neg = (leavebound->m_backend).neg;
    iVar4 = (leavebound->m_backend).prec_elem;
    pnVar13[lVar22].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar13[lVar22].m_backend.prec_elem = iVar4;
    pnVar13 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar21 = local_c0;
joined_r0x00245838:
    pcVar18 = (cpp_dec_float<50U,_int,_void> *)((long)pnVar13 + lVar22 * 0x38);
    if (&local_f8 == &leavebound->m_backend) {
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.neg = false;
      local_f8.exp = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      leavebound = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar18;
    }
    else {
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.neg = false;
      local_f8.exp = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      if (&local_f8 != pcVar18) {
        uVar17 = *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems;
        local_f8.data._M_elems._8_8_ =
             *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 2)
        ;
        local_f8.data._M_elems._16_8_ =
             *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 4)
        ;
        uVar17 = *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar18->data)->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = pcVar18->exp;
        local_f8.neg = pcVar18->neg;
        local_f8.fpclass = pcVar18->fpclass;
        local_f8.prec_elem = pcVar18->prec_elem;
      }
    }
    local_c0 = pcVar21;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_f8,&leavebound->m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar21,&local_f8);
    pSVar14 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
    goto LAB_0024589e;
  case D_ON_BOTH:
  case D_UNDEFINED:
    pnVar13 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
    local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
    local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
    local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_78.exp = pnVar13[lVar23].m_backend.exp;
    local_78.neg = pnVar13[lVar23].m_backend.neg;
    local_78.fpclass = pnVar13[lVar23].m_backend.fpclass;
    local_78.prec_elem = pnVar13[lVar23].m_backend.prec_elem;
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    if (&local_b8 != &enterMax->m_backend) {
      uVar17 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 8);
      local_b8.data._M_elems._32_5_ = SUB85(uVar17,0);
      local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_b8.data._M_elems._0_8_ = *(undefined8 *)(enterMax->m_backend).data._M_elems;
      local_b8.data._M_elems._8_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 2);
      local_b8.data._M_elems._16_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 4);
      uVar17 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 6);
      local_b8.data._M_elems._24_5_ = SUB85(uVar17,0);
      local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_b8.exp = (enterMax->m_backend).exp;
      local_b8.neg = (enterMax->m_backend).neg;
      local_b8.fpclass = (enterMax->m_backend).fpclass;
      local_b8.prec_elem = (enterMax->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_b8,&local_78);
    if (local_b8.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_f8,0,(type *)0x0);
      iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_b8,&local_f8);
      if (iVar11 < 0) {
        pnVar13 = (this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
        uVar5 = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
        uVar7 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
        uVar8 = *(undefined8 *)puVar1;
        uVar9 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar8;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar9;
        *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar5;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar7;
        (leavebound->m_backend).exp = pnVar13[lVar23].m_backend.exp;
        (leavebound->m_backend).neg = pnVar13[lVar23].m_backend.neg;
        iVar4 = pnVar13[lVar23].m_backend.prec_elem;
        (leavebound->m_backend).fpclass = pnVar13[lVar23].m_backend.fpclass;
        (leavebound->m_backend).prec_elem = iVar4;
        pnVar13 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
        puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar8;
        *(undefined8 *)(puVar1 + 2) = uVar9;
        *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar5;
        *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar7;
        pnVar13[lVar22].m_backend.exp = (leavebound->m_backend).exp;
        pnVar13[lVar22].m_backend.neg = (leavebound->m_backend).neg;
        iVar4 = (leavebound->m_backend).prec_elem;
        pnVar13[lVar22].m_backend.fpclass = (leavebound->m_backend).fpclass;
        pnVar13[lVar22].m_backend.prec_elem = iVar4;
        pnVar13 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar21 = local_c0;
        goto joined_r0x00245838;
      }
    }
    pnVar13 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar5 = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
    uVar7 = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
    uVar8 = *(undefined8 *)puVar1;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar8;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar9;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar5;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar7;
    (leavebound->m_backend).exp = pnVar13[lVar23].m_backend.exp;
    (leavebound->m_backend).neg = pnVar13[lVar23].m_backend.neg;
    iVar4 = pnVar13[lVar23].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar13[lVar23].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar4;
    pnVar13 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar8;
    *(undefined8 *)(puVar1 + 2) = uVar9;
    *(undefined8 *)&pnVar13[lVar22].m_backend.data = uVar5;
    *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 8) = uVar7;
    pnVar13[lVar22].m_backend.exp = (leavebound->m_backend).exp;
    pnVar13[lVar22].m_backend.neg = (leavebound->m_backend).neg;
    iVar4 = (leavebound->m_backend).prec_elem;
    pnVar13[lVar22].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar13[lVar22].m_backend.prec_elem = iVar4;
LAB_00244eb6:
    pcVar21 = local_c0;
    pcVar20 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend;
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    pcVar18 = pcVar20;
    if ((&local_f8 != &leavebound->m_backend) &&
       (pcVar18 = &leavebound->m_backend, &local_f8 != pcVar20)) {
      uVar17 = *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems + 8);
      local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
      local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_f8.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems;
      local_f8.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems + 2);
      local_f8.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems + 4);
      uVar17 = *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar20->data)->data)._M_elems + 6);
      local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
      local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_f8.exp = pcVar20->exp;
      local_f8.neg = pcVar20->neg;
      local_f8.fpclass = pcVar20->fpclass;
      local_f8.prec_elem = pcVar20->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar18);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar21,&local_f8);
    pSVar14 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_002455a0:
    pSVar14[lVar22] = P_ON_LOWER;
    return;
  case P_FIXED:
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"XENTER08 This should never happen.","");
    *puVar15 = &PTR__SPxException_0069d438;
    puVar15[1] = puVar15 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
               local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
    *puVar15 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  default:
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"XENTER09 This should never happen.","");
    *puVar15 = &PTR__SPxException_0069d438;
    puVar15[1] = puVar15 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
               local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
    *puVar15 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    pnVar6 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar6[lVar23].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    pnVar13 = pnVar6 + lVar23;
    uVar25 = (pnVar13->m_backend).data._M_elems[0];
    uVar26 = *(uint *)((long)&(pnVar13->m_backend).data + 4);
    uVar27 = *(uint *)((long)&(pnVar13->m_backend).data + 8);
    uVar28 = *(uint *)((long)&(pnVar13->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar6[lVar23].m_backend.data + 0x10);
    uVar29 = *puVar1;
    uVar30 = puVar1[1];
    uVar31 = puVar1[2];
    uVar32 = puVar1[3];
    (leavebound->m_backend).data._M_elems[4] = uVar29;
    (leavebound->m_backend).data._M_elems[5] = uVar30;
    (leavebound->m_backend).data._M_elems[6] = uVar31;
    (leavebound->m_backend).data._M_elems[7] = uVar32;
    (leavebound->m_backend).data._M_elems[0] = uVar25;
    (leavebound->m_backend).data._M_elems[1] = uVar26;
    (leavebound->m_backend).data._M_elems[2] = uVar27;
    (leavebound->m_backend).data._M_elems[3] = uVar28;
    (leavebound->m_backend).exp = pnVar6[lVar23].m_backend.exp;
    (leavebound->m_backend).neg = pnVar6[lVar23].m_backend.neg;
    iVar4 = pnVar6[lVar23].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar6[lVar23].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar4;
    pnVar13 = (this->theUCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_ON_UPPER:
    pnVar6 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar6[lVar23].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    pnVar13 = pnVar6 + lVar23;
    uVar25 = (pnVar13->m_backend).data._M_elems[0];
    uVar26 = *(uint *)((long)&(pnVar13->m_backend).data + 4);
    uVar27 = *(uint *)((long)&(pnVar13->m_backend).data + 8);
    uVar28 = *(uint *)((long)&(pnVar13->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar6[lVar23].m_backend.data + 0x10);
    uVar29 = *puVar1;
    uVar30 = puVar1[1];
    uVar31 = puVar1[2];
    uVar32 = puVar1[3];
    (leavebound->m_backend).data._M_elems[4] = uVar29;
    (leavebound->m_backend).data._M_elems[5] = uVar30;
    (leavebound->m_backend).data._M_elems[6] = uVar31;
    (leavebound->m_backend).data._M_elems[7] = uVar32;
    (leavebound->m_backend).data._M_elems[0] = uVar25;
    (leavebound->m_backend).data._M_elems[1] = uVar26;
    (leavebound->m_backend).data._M_elems[2] = uVar27;
    (leavebound->m_backend).data._M_elems[3] = uVar28;
    (leavebound->m_backend).exp = pnVar6[lVar23].m_backend.exp;
    (leavebound->m_backend).neg = pnVar6[lVar23].m_backend.neg;
    iVar4 = pnVar6[lVar23].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar6[lVar23].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar4;
    pnVar13 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_FREE:
    pnVar13 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar24 = lVar23 * 0x38;
    local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 0x20);
    local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[lVar23].m_backend.data;
    local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[lVar23].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar13[lVar23].m_backend.data + 0x10);
    local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_78.exp = pnVar13[lVar23].m_backend.exp;
    local_78.neg = pnVar13[lVar23].m_backend.neg;
    local_78.fpclass = pnVar13[lVar23].m_backend.fpclass;
    local_78.prec_elem = pnVar13[lVar23].m_backend.prec_elem;
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    if (&local_b8 == &enterMax->m_backend) {
      enterMax = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_78;
    }
    else {
      local_b8.data._M_elems._32_5_ = local_78.data._M_elems._32_5_;
      local_b8.data._M_elems[9]._1_3_ = local_78.data._M_elems[9]._1_3_;
      local_b8.data._M_elems._24_5_ = local_78.data._M_elems._24_5_;
      local_b8.data._M_elems[7]._1_3_ = local_78.data._M_elems[7]._1_3_;
      local_b8.prec_elem = local_78.prec_elem;
      local_b8.fpclass = local_78.fpclass;
      local_b8.data._M_elems._0_8_ = local_78.data._M_elems._0_8_;
      local_b8.data._M_elems._8_8_ = local_78.data._M_elems._8_8_;
      local_b8.data._M_elems._16_8_ = local_78.data._M_elems._16_8_;
      local_b8.exp = local_78.exp;
      local_b8.neg = local_78.neg;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_b8,&enterMax->m_backend);
    if (local_b8.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_f8,0,(type *)0x0);
      iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_b8,&local_f8);
      if (0 < iVar11) {
        lVar23 = 0x9f8;
        lVar16 = 0xa28;
        goto LAB_00245a94;
      }
    }
    lVar23 = 0x9e0;
    lVar16 = 0xa10;
LAB_00245a94:
    lVar16 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar16);
    uVar17 = *(undefined8 *)(lVar16 + 0x20 + lVar24);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar7 = *(undefined8 *)(lVar16 + lVar24);
    uVar8 = ((undefined8 *)(lVar16 + lVar24))[1];
    puVar15 = (undefined8 *)(lVar16 + 0x10 + lVar24);
    uVar9 = *puVar15;
    uVar10 = puVar15[1];
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar9;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar10;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar7;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar8;
    (leavebound->m_backend).exp = *(int *)(lVar16 + 0x28 + lVar24);
    (leavebound->m_backend).neg = *(bool *)(lVar16 + 0x2c + lVar24);
    uVar5 = *(undefined8 *)(lVar16 + 0x30 + lVar24);
    (leavebound->m_backend).fpclass = (int)uVar5;
    (leavebound->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
    lVar23 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar23);
    lVar24 = lVar22 * 0x38;
    *(undefined8 *)(lVar23 + 0x20 + lVar24) = uVar17;
    puVar15 = (undefined8 *)(lVar23 + 0x10 + lVar24);
    *puVar15 = uVar9;
    puVar15[1] = uVar10;
    *(undefined8 *)(lVar23 + lVar24) = uVar7;
    ((undefined8 *)(lVar23 + lVar24))[1] = uVar8;
    *(int *)(lVar23 + 0x28 + lVar24) = (leavebound->m_backend).exp;
    *(bool *)(lVar23 + 0x2c + lVar24) = (leavebound->m_backend).neg;
    *(undefined8 *)(lVar23 + 0x30 + lVar24) = *(undefined8 *)&(leavebound->m_backend).fpclass;
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[lVar22] = D_UNDEFINED;
    return;
  }
  *(undefined8 *)((long)&pnVar13[lVar22].m_backend.data + 0x20) = uVar17;
  puVar1 = (uint *)((long)&pnVar13[lVar22].m_backend.data + 0x10);
  *puVar1 = uVar29;
  puVar1[1] = uVar30;
  puVar1[2] = uVar31;
  puVar1[3] = uVar32;
  pnVar6 = pnVar13 + lVar22;
  (pnVar6->m_backend).data._M_elems[0] = uVar25;
  *(uint *)((long)&(pnVar6->m_backend).data + 4) = uVar26;
  *(uint *)((long)&(pnVar6->m_backend).data + 8) = uVar27;
  *(uint *)((long)&(pnVar6->m_backend).data + 0xc) = uVar28;
  pnVar13[lVar22].m_backend.exp = (leavebound->m_backend).exp;
  pnVar13[lVar22].m_backend.neg = (leavebound->m_backend).neg;
  iVar4 = (leavebound->m_backend).prec_elem;
  pnVar13[lVar22].m_backend.fpclass = (leavebound->m_backend).fpclass;
  pnVar13[lVar22].m_backend.prec_elem = iVar4;
  SVar12 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::dualColStatus(&this->
                            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ,iVar11);
  (this->
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thedesc.colstat.data[lVar22] = SVar12;
  if (SVar12 == D_ON_BOTH) {
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_f8,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend);
    pcVar21 = local_c0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(local_c0,&local_f8);
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_f8,
               &(this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend);
  }
  else {
    if (SVar12 == D_ON_LOWER) {
      pnVar6 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar13 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if (SVar12 != D_ON_UPPER) {
        return;
      }
      pnVar6 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar13 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_f8,&pnVar6[lVar22].m_backend,&pnVar13[lVar22].m_backend);
    pcVar21 = local_c0;
  }
LAB_00245c91:
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar21,&local_f8);
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals2
(
   int leaveIdx,
   R enterMax,
   R& leavebound,
   StableSum<R>& objChange
)
{
   int idx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   SPxId leftId = this->baseId(leaveIdx);

   if(leftId.isSPxRowId())
   {
      idx = this->number(SPxRowId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER04 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
#if 1
         throw SPxInternalCodeException("XENTER05 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER98 ERROR: not yet debugged!" << std::endl;)

         if((*theCoPvec)[leaveIdx] - theLBbound[leaveIdx] <
               theUBbound[leaveIdx] - (*theCoPvec)[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
         }

         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);
         throw SPxInternalCodeException("XENTER06 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax < 0)
            leavebound = theUBbound[leaveIdx];
         else
            leavebound = theLBbound[leaveIdx];

         theLRbound[idx] = leavebound;
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER07 This should never happen.");
      }

      SPxOut::debug(this, "DENTER06 SPxSolverBase::getEnterVals2(): row {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(leftId.isSPxColId());
      idx = this->number(SPxColId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
         }

         ds.colStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER08 This should never happen.");
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
            leavebound = theLBbound[leaveIdx];
         else
            leavebound = theUBbound[leaveIdx];

         theUCbound[idx] =
            theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER09 This should never happen.");
      }

      SPxOut::debug(this, "DENTER07 SPxSolverBase::getEnterVals2(): col {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.colStatus(idx), objChange);
   }
}